

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

char * cJSON_SetValuestring(cJSON *object,char *valuestring)

{
  size_t sVar1;
  size_t sVar2;
  char *copy;
  char *valuestring_local;
  cJSON *object_local;
  
  if (((object->type & 0x10U) == 0) || ((object->type & 0x100U) != 0)) {
    object_local = (cJSON *)0x0;
  }
  else {
    sVar1 = strlen(valuestring);
    sVar2 = strlen(object->valuestring);
    if (sVar2 < sVar1) {
      object_local = (cJSON *)cJSON_strdup((uchar *)valuestring,&global_hooks);
      if (object_local == (cJSON *)0x0) {
        object_local = (cJSON *)0x0;
      }
      else {
        if (object->valuestring != (char *)0x0) {
          cJSON_free(object->valuestring);
        }
        object->valuestring = (char *)object_local;
      }
    }
    else {
      strcpy(object->valuestring,valuestring);
      object_local = (cJSON *)object->valuestring;
    }
  }
  return (char *)object_local;
}

Assistant:

CJSON_PUBLIC(char*) cJSON_SetValuestring(cJSON *object, const char *valuestring)
{
    char *copy = NULL;
    /* if object's type is not cJSON_String or is cJSON_IsReference, it should not set valuestring */
    if (!(object->type & cJSON_String) || (object->type & cJSON_IsReference))
    {
        return NULL;
    }
    if (strlen(valuestring) <= strlen(object->valuestring))
    {
        strcpy(object->valuestring, valuestring);
        return object->valuestring;
    }
    copy = (char*) cJSON_strdup((const unsigned char*)valuestring, &global_hooks);
    if (copy == NULL)
    {
        return NULL;
    }
    if (object->valuestring != NULL)
    {
        cJSON_free(object->valuestring);
    }
    object->valuestring = copy;

    return copy;
}